

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall iqxmlrpc::http::Packet::~Packet(Packet *this)

{
  Packet *this_local;
  
  ~Packet(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Packet::~Packet()
{
}